

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O2

void __thiscall QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler(QEvdevTouchScreenHandler *this)

{
  QEvdevTouchScreenData *this_00;
  
  *(undefined ***)this = &PTR_metaObject_00150b98;
  if (-1 < *(int *)(this + 0x18)) {
    qt_safe_close(*(int *)(this + 0x18));
  }
  this_00 = *(QEvdevTouchScreenData **)(this + 0x20);
  if (this_00 != (QEvdevTouchScreenData *)0x0) {
    QEvdevTouchScreenData::~QEvdevTouchScreenData(this_00);
  }
  operator_delete(this_00,0x160);
  unregisterPointingDevice(this);
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler()
{
#if QT_CONFIG(mtdev)
    if (m_mtdev) {
        mtdev_close(m_mtdev);
        free(m_mtdev);
    }
#endif

    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;

    unregisterPointingDevice();
}